

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void __thiscall
HighsHashTree<int,_int>::InnerLeaf<4>::move_backward(InnerLeaf<4> *this,int *first,int *last)

{
  HighsHashTableEntry<int,_int> *__n;
  HighsHashTableEntry<int,_int> *__x;
  reference __dest;
  reference __src;
  int *in_RDX;
  int *in_RSI;
  HighsHashTableEntry<int,_int> *in_RDI;
  difference_type in_stack_ffffffffffffffc8;
  HighsHashTableEntry<int,_int> *in_stack_ffffffffffffffd0;
  HighsHashTableEntry<int,_int> *in_stack_ffffffffffffffe0;
  
  std::array<HighsHashTableEntry<int,_int>,_54UL>::begin
            ((array<HighsHashTableEntry<int,_int>,_54UL> *)0x56f3d9);
  __n = std::next<HighsHashTableEntry<int,int>*>
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::array<HighsHashTableEntry<int,_int>,_54UL>::begin
            ((array<HighsHashTableEntry<int,_int>,_54UL> *)0x56f3fe);
  __x = std::next<HighsHashTableEntry<int,int>*>(in_stack_ffffffffffffffd0,(difference_type)__n);
  std::array<HighsHashTableEntry<int,_int>,_54UL>::begin
            ((array<HighsHashTableEntry<int,_int>,_54UL> *)0x56f424);
  std::next<HighsHashTableEntry<int,int>*>(__x,(difference_type)__n);
  std::move_backward<HighsHashTableEntry<int,int>*,HighsHashTableEntry<int,int>*>
            (in_stack_ffffffffffffffe0,in_RDI,__x);
  __dest = std::array<unsigned_long,_55UL>::operator[]
                     ((array<unsigned_long,_55UL> *)__x,(size_type)__n);
  __src = std::array<unsigned_long,_55UL>::operator[]
                    ((array<unsigned_long,_55UL> *)__x,(size_type)__n);
  memmove(__dest,__src,(long)(*in_RDX - *in_RSI) << 3);
  return;
}

Assistant:

void move_backward(const int& first, const int& last) {
      // move elements backwards
      std::move_backward(std::next(entries.begin(), first),
                         std::next(entries.begin(), last),
                         std::next(entries.begin(), last + 1));
      memmove(&hashes[first + 1], &hashes[first],
              sizeof(hashes[0]) * (last - first));
    }